

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O0

void QtGuiTest::synthesizeWheelEvent(int rollCount,KeyboardModifiers modifiers)

{
  QPoint pixelDelta;
  bool bVar1;
  QDebug *o;
  int in_ESI;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  QPoint position;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  int in_stack_fffffffffffffed8;
  undefined4 uVar2;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar3;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  QMessageLogger *in_stack_fffffffffffffef0;
  QDebug *in_stack_fffffffffffffef8;
  QPointF *in_stack_ffffffffffffff00;
  QPointF *in_stack_ffffffffffffff08;
  QDebug in_stack_ffffffffffffff10;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff28;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffff34;
  QPoint in_stack_ffffffffffffff38;
  Representation in_stack_ffffffffffffff40;
  ScrollPhase in_stack_ffffffffffffff60;
  MouseEventSource in_stack_ffffffffffffff68;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  Representation local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  local_3c.m_i = in_ESI;
  lcQtGuiTest();
  anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x424ddd);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffef0,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (char *)0x424df6);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
    o = QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
    QDebug::QDebug(&local_50,o);
    operator<<<QFlags<Qt::KeyboardModifier>,_true>
              ((QDebug *)in_stack_ffffffffffffff08,
               (QFlags<Qt::KeyboardModifier>)in_stack_ffffffffffffff1c.i);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    local_10 = 0;
  }
  QCursor::pos();
  QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (QPoint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (QPoint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  uVar2 = 0;
  uVar3 = 0;
  pixelDelta.yp.m_i = local_3c.m_i;
  pixelDelta.xp.m_i = in_stack_ffffffffffffff40.m_i;
  bVar1 = QWindowSystemInterface::handleWheelEvent
                    ((QWindow *)in_stack_ffffffffffffff10.stream,in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff00,pixelDelta,in_stack_ffffffffffffff38,
                     (KeyboardModifiers)in_stack_ffffffffffffff34.i,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff68);
  if (bVar1) {
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiTest();
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffee4,uVar3),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffedc,uVar2));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x424fa6);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffef0,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee4,(char *)CONCAT44(in_stack_fffffffffffffedc,uVar2),
                 (char *)0x424fbc);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff38);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiTest();
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffee4,uVar3),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffedc,uVar2));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
      anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x425048);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffef0,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee4,(char *)CONCAT44(in_stack_fffffffffffffedc,uVar2),
                 (char *)0x42505e);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff10);
      local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtGuiTest::synthesizeWheelEvent(int rollCount, Qt::KeyboardModifiers modifiers)
{
    deb << "Synthesizing wheel event:" << rollCount << modifiers;

    QPoint position = QCursor::pos();
    if (QWindowSystemInterface::handleWheelEvent(nullptr, position, position,
                                                 QPoint(), QPoint(0, -rollCount), modifiers)) {

        // It's unlikely that a shortcut relates to a subsequent wheel event.
        // But it's not harmful, to send posted events here.
        QCoreApplication::sendPostedEvents();
        deb << "(success)";
    } else {
        deb << "(failure)";
    }
}